

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O2

uint64_t farmhash64_uo_with_seed(char *s,size_t len,uint64_t seed)

{
  uint64_t uVar1;
  
  if (len < 0x41) {
    uVar1 = farmhash64_na_with_seed(s,len,seed);
    return uVar1;
  }
  uVar1 = farmhash64_uo_with_seeds(s,len,0,seed);
  return uVar1;
}

Assistant:

uint64_t farmhash64_uo_with_seed(const char *s, size_t len, uint64_t seed) {
  return len <= 64 ? farmhash64_na_with_seed(s, len, seed) :
      farmhash64_uo_with_seeds(s, len, 0, seed);
}